

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

FILE * js_std_file_get(JSContext *ctx,JSValue obj)

{
  JSValue obj_00;
  long *plVar1;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSContext *in_RDI;
  JSSTDFile *s;
  undefined8 in_stack_ffffffffffffffd8;
  FILE *local_8;
  
  obj_00.tag = in_RDX;
  obj_00.u.float64 = in_RSI.float64;
  plVar1 = (long *)JS_GetOpaque2(in_RDI,obj_00,(JSClassID)((ulong)in_stack_ffffffffffffffd8 >> 0x20)
                                );
  if (plVar1 == (long *)0x0) {
    local_8 = (FILE *)0x0;
  }
  else if (*plVar1 == 0) {
    JS_ThrowTypeError(in_RDI,"invalid file handle");
    local_8 = (FILE *)0x0;
  }
  else {
    local_8 = (FILE *)*plVar1;
  }
  return local_8;
}

Assistant:

static FILE *js_std_file_get(JSContext *ctx, JSValueConst obj)
{
    JSSTDFile *s = JS_GetOpaque2(ctx, obj, js_std_file_class_id);
    if (!s)
        return NULL;
    if (!s->f) {
        JS_ThrowTypeError(ctx, "invalid file handle");
        return NULL;
    }
    return s->f;
}